

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconstruction.cpp
# Opt level: O3

void lts2::BinaryReconstructionWithBIHT
               (Mat *X,LBDOperator *LBD,Mat *binaryDescriptor,int iterations,float sparsityCoeff,
               Size *patchSize,float patchMean,int norm,string *wavelet)

{
  long lVar1;
  int iVar2;
  LBDOperator *pLVar3;
  int iVar4;
  _InputArray *p_Var5;
  ostream *poVar6;
  undefined8 uVar7;
  ulong uVar8;
  Size SVar9;
  ulong uVar10;
  long lVar11;
  float fVar12;
  int iVar13;
  float fVar14;
  double dVar15;
  int wh;
  int ww;
  int fsize;
  double *Q;
  double *P;
  _InputArray local_298;
  int local_280;
  float local_27c;
  Mat *local_278;
  float local_270;
  float local_26c;
  _OutputArray local_268;
  LBDOperator *local_250;
  _InputArray local_248;
  undefined8 uStack_230;
  Mat X_im;
  undefined4 uStack_1e4;
  Size local_1d8;
  undefined8 uStack_1d0;
  double local_188;
  double local_180;
  _InputArray local_178 [2];
  undefined8 *local_138;
  long *local_130;
  SignOperator A;
  Size local_108;
  Size local_100;
  int local_f8;
  int local_f4;
  Mat C0;
  Mat nablaJ;
  
  local_280 = norm;
  local_278 = binaryDescriptor;
  local_270 = (float)iterations;
  local_26c = patchMean;
  local_250 = LBD;
  if ((norm != 2) && (norm != 4)) {
LAB_00108e15:
    _X_im = &local_1d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&X_im,"norm == cv::NORM_L1 || norm == cv::NORM_L2","");
    uVar7 = cv::error(-0xd7,(string *)&X_im,"BinaryReconstructionWithBIHT",
                      "/workspace/llm4binary/github/license_c_cmakelists/sansuiso[P]LBDReconstruction/src/LBDReconstruction/reconstruction.cpp"
                      ,0x167);
    SignOperator::~SignOperator(&A);
    cv::Mat::~Mat(&C0);
    cv::Mat::~Mat(&nablaJ);
    cv::Mat::~Mat((Mat *)local_178);
    cv::Mat::~Mat(&X_im);
    _Unwind_Resume(uVar7);
  }
  iVar2 = *(int *)(binaryDescriptor + 0xc);
  if (*(int *)(binaryDescriptor + 0xc) < *(int *)(binaryDescriptor + 8)) {
    iVar2 = *(int *)(binaryDescriptor + 8);
  }
  dVar15 = 1.0;
  if ((double)sparsityCoeff <= 1.0) {
    dVar15 = (double)sparsityCoeff;
  }
  iVar13 = patchSize->width;
  iVar4 = patchSize->height;
  local_27c = rintf((float)(iVar4 * iVar13) *
                    (float)(double)(~-(ulong)(dVar15 <= 0.0) & (ulong)dVar15));
  local_f8 = iVar13;
  local_f4 = iVar4;
  cv::Mat::create(X,&local_f8,5);
  local_178[0].obj = &X_im;
  local_1d8.width = 0;
  local_1d8.height = 0;
  uStack_1d0 = 0;
  _X_im = 0;
  uStack_1e4 = 0;
  local_178[0].flags = 0xc1020006;
  local_178[0].sz = (Size)&DAT_400000001;
  cv::noArray();
  cv::Mat::setTo((_InputArray *)X,local_178);
  cv::Mat::Mat(&X_im);
  cv::Mat::Mat((Mat *)local_178);
  cv::Mat::Mat(&nablaJ);
  P = (double *)0x0;
  Q = (double *)0x0;
  fsize = 0;
  WaveletCoef(wavelet,&P,&Q,&fsize);
  local_100 = *patchSize;
  cv::Mat::create(&X_im,&local_100,5);
  _C0 = (double)local_26c;
  local_248.obj = &C0;
  local_248.flags = -0x3efdfffa;
  local_248.sz = (Size)&DAT_400000001;
  cv::noArray();
  cv::Mat::setTo((_InputArray *)&X_im,&local_248);
  WaveletTransform2D(&X_im,X,P,Q,fsize,&ww,&wh,-1);
  local_298.flags = 0;
  local_298._4_4_ = 0;
  cv::Mat::Mat((Mat *)&local_248,X,(Rect_ *)&local_298);
  cv::Mat::clone();
  cv::Mat::~Mat((Mat *)&local_248);
  InverseWaveletTransform2D(X,&X_im,P,Q,fsize,&ww,&wh);
  SignOperator::SignOperator(&A);
  local_108 = *patchSize;
  cv::Mat::create(X,&local_108,5);
  local_248.sz.width = 0;
  local_248.sz.height = 0;
  uStack_230 = 0;
  local_248.flags = 0;
  local_248._4_4_ = 0;
  local_248.obj = (Mat *)0x0;
  local_298.flags = -0x3efdfffa;
  local_298.sz = (Size)&DAT_400000001;
  local_298.obj = (Mat *)&local_248;
  cv::noArray();
  cv::Mat::setTo((_InputArray *)X,&local_298);
  if (local_280 == 4) {
    (*(local_250->super_LinearOperator)._vptr_LinearOperator[3])(local_250,local_278,&X_im);
    WaveletTransform2D(&X_im,X,P,Q,fsize,&ww,&wh,-1);
    local_248.sz.width = 0;
    local_248.sz.height = 0;
    local_248.flags = 0x1010000;
    local_248.obj = X;
    p_Var5 = (_InputArray *)cv::noArray();
    dVar15 = (double)cv::norm(&local_248,4,p_Var5);
    if (0.0 < (float)dVar15) {
      local_248.sz.width = 0;
      local_248.sz.height = 0;
      local_248.flags = 0x2010000;
      local_248.obj = X;
      cv::Mat::convertTo((_OutputArray *)X,(int)&local_248,1.0 / (double)(float)dVar15,0.0);
    }
  }
  iVar13 = (int)local_27c;
  local_188 = (double)(1.0 / (float)iVar2);
  local_180 = local_188 * 0.5;
  fVar14 = 1.4013e-45;
  if (1 < (int)local_270) {
    fVar14 = local_270;
  }
  fVar12 = 0.0;
  do {
    InverseWaveletTransform2D(X,&X_im,P,Q,fsize,&ww,&wh);
    (*(local_250->super_LinearOperator)._vptr_LinearOperator[2])(local_250,&X_im,local_178);
    local_27c = fVar12;
    if (local_280 == 2) {
      local_248.sz.width = 0;
      local_248.sz.height = 0;
      local_248.flags = 0x1010000;
      local_268.super__InputArray.obj = local_178;
      local_298.sz.width = 0;
      local_298.sz.height = 0;
      local_298.flags = 0x1010000;
      local_298.obj = local_278;
      local_268.super__InputArray.sz.width = 0;
      local_268.super__InputArray.sz.height = 0;
      local_268.super__InputArray.flags = -0x3dff0000;
      local_248.obj = local_268.super__InputArray.obj;
      p_Var5 = (_InputArray *)cv::noArray();
      cv::subtract(&local_248,&local_298,&local_268,p_Var5,-1);
      (*(local_250->super_LinearOperator)._vptr_LinearOperator[3])(local_250,local_178,&X_im);
      WaveletTransform2D(&X_im,&nablaJ,P,Q,fsize,&ww,&wh,-1);
      local_248.sz.width = 0;
      local_248.sz.height = 0;
      local_248.flags = 0x2010000;
      local_248.obj = &nablaJ;
      cv::Mat::convertTo((_OutputArray *)&nablaJ,(int)&local_248,local_180,0.0);
    }
    else {
      local_248.sz.width = 0;
      local_248.sz.height = 0;
      local_248.flags = 0x1010000;
      local_268.super__InputArray.obj = local_178;
      local_298.sz.width = 0;
      local_298.sz.height = 0;
      local_298.flags = 0x1010000;
      local_298.obj = local_278;
      local_268.super__InputArray.sz.width = 0;
      local_268.super__InputArray.sz.height = 0;
      local_268.super__InputArray.flags = 0x2010000;
      local_248.obj = local_268.super__InputArray.obj;
      cv::multiply(&local_248,&local_298,&local_268,1.0,-1);
      if ((local_178[0].flags & 0xfffU) != 5) {
        local_248._0_8_ = &local_248.sz;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_248,"src.type() == CV_32F","");
        cv::error(-0xd7,(string *)&local_248,"ExtractTheNegativePart",
                  "/workspace/llm4binary/github/license_c_cmakelists/sansuiso[P]LBDReconstruction/src/LBDReconstruction/reconstruction.cpp"
                  ,0x67);
        goto LAB_00108e15;
      }
      local_248._4_4_ = SUB84(*local_138,0);
      local_248.flags = (int)((ulong)*local_138 >> 0x20);
      cv::Mat::create(local_178,&local_248,5);
      pLVar3 = local_250;
      iVar2 = (int)local_178[0].obj;
      uVar8 = (ulong)local_178[0].obj & 0xffffffff;
      if (((uint)local_178[0].flags >> 0xe & 1) == 0) {
        iVar4 = local_178[0].obj._4_4_;
        if (0 < (int)local_178[0].obj) goto LAB_001089d5;
      }
      else {
        iVar4 = local_178[0].obj._4_4_ * (int)local_178[0].obj * (int)local_178[0].obj;
        local_178[0].obj = (void *)CONCAT44(iVar4,1);
        uVar8 = 1;
LAB_001089d5:
        lVar1 = *local_130;
        uVar10 = 0;
        SVar9 = local_178[0].sz;
        do {
          if (0 < iVar4) {
            lVar11 = 0;
            do {
              *(uint *)((long)SVar9 + lVar11 * 4) =
                   -(uint)(*(float *)((long)SVar9 + lVar11 * 4) < 0.0) & 0xbf800000;
              lVar11 = lVar11 + 1;
            } while (iVar4 != (int)lVar11);
          }
          uVar10 = uVar10 + 1;
          SVar9 = (Size)((long)SVar9 + lVar1);
        } while (uVar10 != uVar8);
        if (((uint)local_178[0].flags >> 0xe & 1) != 0) {
          local_178[0].obj = (void *)CONCAT44((iVar4 / iVar2) / iVar2,iVar2);
        }
      }
      local_248.sz.width = 0;
      local_248.sz.height = 0;
      local_248.flags = 0x1010000;
      local_298.sz.width = 0;
      local_298.sz.height = 0;
      local_298.flags = 0x1010000;
      local_298.obj = local_278;
      local_268.super__InputArray.sz.width = 0;
      local_268.super__InputArray.sz.height = 0;
      local_268.super__InputArray.flags = 0x2010000;
      local_268.super__InputArray.obj = local_178;
      local_248.obj = local_178;
      cv::multiply(&local_248,&local_298,&local_268,1.0,-1);
      (*(pLVar3->super_LinearOperator)._vptr_LinearOperator[3])(pLVar3,local_178,&X_im);
      WaveletTransform2D(&X_im,&nablaJ,P,Q,fsize,&ww,&wh,-1);
      local_248.sz.width = 0;
      local_248.sz.height = 0;
      local_248.flags = 0x2010000;
      local_248.obj = &nablaJ;
      cv::Mat::convertTo((_OutputArray *)&nablaJ,(int)&local_248,local_188,0.0);
    }
    local_248.sz.width = 0;
    local_248.sz.height = 0;
    local_248.flags = 0x1010000;
    local_298.sz.width = 0;
    local_298.sz.height = 0;
    local_298.flags = 0x1010000;
    local_268.super__InputArray.sz.width = 0;
    local_268.super__InputArray.sz.height = 0;
    local_268.super__InputArray.flags = -0x3dff0000;
    local_298.obj = &nablaJ;
    local_268.super__InputArray.obj = X;
    local_248.obj = X;
    p_Var5 = (_InputArray *)cv::noArray();
    fVar12 = local_27c;
    cv::subtract(&local_248,&local_298,&local_268,p_Var5,-1);
    ProxL0(X,iVar13);
    InverseWaveletTransform2D(X,&X_im,P,Q,fsize,&ww,&wh);
    ProxRangeConstraint(&X_im,0.0,1.0);
    ProxMeanConstraint(&X_im,local_26c);
    fVar12 = (float)((int)fVar12 + 1);
    if (fVar12 == fVar14) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Stopped after ",0xe)
      ;
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)fVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," iterations ",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," (max allowed was ",0x12);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)local_270);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      local_248.sz.width = 0;
      local_248.sz.height = 0;
      local_248.flags = 0x1010000;
      local_248.obj = X;
      p_Var5 = (_InputArray *)cv::noArray();
      cv::norm(&local_248,4,p_Var5);
      InverseWaveletTransform2D(X,&X_im,P,Q,fsize,&ww,&wh);
      local_248.sz.width = 0;
      local_248.sz.height = 0;
      local_248.flags = 0x1010000;
      local_298.sz.width = 0;
      local_298.sz.height = 0;
      local_298.flags = 0x3010000;
      local_298.obj = X;
      local_248.obj = &X_im;
      p_Var5 = (_InputArray *)cv::noArray();
      cv::normalize(&local_248,(_InputOutputArray *)&local_298,0.0,1.0,0x20,-1,p_Var5);
      if (P != (double *)0x0) {
        operator_delete__(P);
      }
      if (Q != (double *)0x0) {
        operator_delete__(Q);
      }
      SignOperator::~SignOperator(&A);
      cv::Mat::~Mat(&C0);
      cv::Mat::~Mat(&nablaJ);
      cv::Mat::~Mat((Mat *)local_178);
      cv::Mat::~Mat(&X_im);
      return;
    }
  } while( true );
}

Assistant:

void lts2::BinaryReconstructionWithBIHT(cv::Mat &X, LBDOperator &LBD, cv::Mat const &binaryDescriptor,
                                        int iterations, float sparsityCoeff, cv::Size patchSize, float patchMean,
                                        int norm, std::string const &wavelet)
{
  CV_Assert(norm == cv::NORM_L1 || norm == cv::NORM_L2);

  int const M = MAX(binaryDescriptor.rows, binaryDescriptor.cols);
  float const tau = 1.0 / (float)M;

  sparsityCoeff = MAX(MIN(sparsityCoeff, 1.0), 0.0);
  int const K = (int)rintf( sparsityCoeff*patchSize.area() );

  X.create(patchSize, CV_32FC1);
  X.setTo(cv::Scalar(0.0));

  cv::Mat X_im;
  cv::Mat Ax;
  cv::Mat nablaJ;

  // Wavelet basis
  double *P = NULL, *Q = NULL;
  int fsize = 0, ww, wh;
  lts2::WaveletCoef(wavelet, &P, &Q, &fsize);

  X_im.create(patchSize, CV_32F);
  X_im.setTo(cv::Scalar(patchMean));
  lts2::WaveletTransform2D(X_im, X, P, Q, fsize, &ww, &wh);
  cv::Mat C0 = X(cv::Rect(0,0,ww,wh)).clone();
  lts2::InverseWaveletTransform2D(X, X_im, P, Q, fsize, &ww, &wh);

  // Operators
  SignOperator A;

  // Special init if norm = L2
  X.create(patchSize, CV_32FC1);
  X.setTo(cv::Scalar(0.0));
  if (norm == cv::NORM_L2)
  {
    LBD.ApplyConjugate(binaryDescriptor, X_im);
    lts2::WaveletTransform2D(X_im, X, P, Q, fsize, &ww, &wh);
    float norm_x = cv::norm(X);
    if (norm_x > 0.0) X /= norm_x;
  }

  bool hasConverged = false;
  int iter = 0;

  while (!hasConverged)
  {
    // Back from the wavelet world
    lts2::InverseWaveletTransform2D(X, X_im, P, Q, fsize, &ww, &wh);
    LBD.Apply(X_im, Ax);

    // Step 1a : gradient
    if (norm == cv::NORM_L1)
    {
      Ax -= binaryDescriptor;

      LBD.ApplyConjugate(Ax, X_im);
      lts2::WaveletTransform2D(X_im, nablaJ, P, Q, fsize, &ww, &wh);
      nablaJ *= (0.5*tau);
    }
    else
    {
      cv::multiply(Ax, binaryDescriptor, Ax);
      ExtractTheNegativePart(Ax, Ax);

      cv::multiply(Ax, binaryDescriptor, Ax);
      LBD.ApplyConjugate(Ax, X_im);
      lts2::WaveletTransform2D(X_im, nablaJ, P, Q, fsize, &ww, &wh);

      nablaJ *= tau;
    }

    // Step 1b : update estimate
    X -= nablaJ;

    // Step 2 : enforce sparsity
    lts2::ProxL0(X, K);
    lts2::InverseWaveletTransform2D(X, X_im, P, Q, fsize, &ww, &wh);
    lts2::ProxRangeConstraint(X_im, 0.0, 1.0);
    lts2::ProxMeanConstraint(X_im, patchMean);

    // Termination criterion
    hasConverged = (++iter >= iterations);  // Iterations count limit
  }

#ifdef DEBUG
  std::cout << "Stopped after " << iter << " iterations " << " (max allowed was " << iterations << ")" << std::endl;
#endif

  // Normalize by projecting to the sphere
  float norm_x = cv::norm(X);
//  if (norm_x < LTS2_EPSILON)
//    norm_x = 1.0
//  X /= norm_x;

  lts2::InverseWaveletTransform2D(X, X_im, P, Q, fsize, &ww, &wh);
  cv::normalize(X_im, X, 0.0, 1.0, cv::NORM_MINMAX);

  // Cleanup
  delete[] P;
  delete[] Q;
}